

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::doExtract
          (UnicodeString *this,int32_t start,int32_t length,UChar *dst,int32_t dstStart)

{
  char16_t *pcVar1;
  uint local_20;
  int local_1c;
  
  local_20 = length;
  local_1c = start;
  pinIndices(this,&local_1c,(int32_t *)&local_20);
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
      (undefined1  [56])0x0) {
    pcVar1 = (this->fUnion).fFields.fArray;
  }
  else {
    pcVar1 = (char16_t *)((long)&this->fUnion + 2);
  }
  if ((pcVar1 + local_1c != dst + dstStart) && (0 < (int)local_20)) {
    memmove(dst + dstStart,pcVar1 + local_1c,(ulong)local_20 * 2);
  }
  return;
}

Assistant:

void
UnicodeString::doExtract(int32_t start,
             int32_t length,
             UChar *dst,
             int32_t dstStart) const
{
  // pin indices to legal values
  pinIndices(start, length);

  // do not copy anything if we alias dst itself
  const UChar *array = getArrayStart();
  if(array + start != dst + dstStart) {
    us_arrayCopy(array, start, dst, dstStart, length);
  }
}